

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BG_FactorGraphCreator.cpp
# Opt level: O1

void __thiscall
BG_FactorGraphCreator::Construct_AgentTypePair_Variables(BG_FactorGraphCreator *this)

{
  pointer *ppVVar1;
  vector<unsigned_int,std::allocator<unsigned_int>> *this_00;
  iterator __position;
  iterator __position_00;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ostream *poVar3;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  pointer puVar4;
  undefined4 extraout_var_04;
  element_type *peVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  size_type __n;
  Index atI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nrTypes;
  Var v;
  uint local_64;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *local_60;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_58;
  Var local_40;
  
  iVar2 = (*(((this->_m_bg).px)->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
            super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
            _vptr_Interface_ProblemToPolicyDiscrete[3])();
  local_60 = &this->_m_var_indices;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::resize(&this->_m_var_indices,CONCAT44(extraout_var,iVar2));
  iVar2 = (*(((this->_m_bg).px)->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
            super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
            _vptr_Interface_ProblemToPolicyDiscrete[3])();
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_58,CONCAT44(extraout_var_00,iVar2),(allocator_type *)&local_40);
  __n = 0;
  uVar7 = 0;
  do {
    iVar2 = (*(((this->_m_bg).px)->super_BayesianGameIdenticalPayoffInterface).
              super_BayesianGameBase.super_Interface_ProblemToPolicyDiscretePure.
              super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete[3])();
    uVar6 = (ulong)uVar7;
    if (CONCAT44(extraout_var_01,iVar2) <= uVar6) {
      if (0 < this->_m_verbosity) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"FactorGraph has ",0x10);
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," variables (agent-types)",0x18);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
      }
      uVar7 = 0;
      while( true ) {
        iVar2 = (*(((this->_m_bg).px)->super_BayesianGameIdenticalPayoffInterface).
                  super_BayesianGameBase.super_Interface_ProblemToPolicyDiscretePure.
                  super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete[3]
                )();
        uVar6 = (ulong)uVar7;
        if (CONCAT44(extraout_var_02,iVar2) <= uVar6) break;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
                  ((local_60->
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + uVar6,
                   local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar6]);
        uVar7 = uVar7 + 1;
      }
      std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::reserve(&this->_m_vars,__n);
      local_64 = 0;
      uVar7 = 0;
      while( true ) {
        iVar2 = (*(((this->_m_bg).px)->super_BayesianGameIdenticalPayoffInterface).
                  super_BayesianGameBase.super_Interface_ProblemToPolicyDiscretePure.
                  super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete[3]
                )();
        uVar6 = (ulong)uVar7;
        if (CONCAT44(extraout_var_03,iVar2) <= uVar6) {
          if (local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_58.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_58.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_58.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          return;
        }
        peVar5 = (this->_m_bg).px;
        puVar4 = (peVar5->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
                 _m_nrTypes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(peVar5->super_BayesianGameIdenticalPayoffInterface).
                          super_BayesianGameBase._m_nrTypes.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)puVar4 >> 3) <= uVar6) break;
        uVar8 = 0;
        while (uVar8 < puVar4[uVar6]) {
          uVar9 = (ulong)local_64;
          iVar2 = (*(peVar5->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
                    super_Interface_ProblemToPolicyDiscretePure.
                    super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete
                    [4])(peVar5,uVar6);
          local_40._states = CONCAT44(extraout_var_04,iVar2);
          this_00 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                    ((local_60->
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + uVar6);
          __position._M_current = *(uint **)(this_00 + 8);
          local_40._label = uVar9;
          if (__position._M_current == *(uint **)(this_00 + 0x10)) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>(this_00,__position,&local_64);
          }
          else {
            *__position._M_current = local_64;
            *(uint **)(this_00 + 8) = __position._M_current + 1;
          }
          __position_00._M_current =
               (this->_m_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl
               .super__Vector_impl_data._M_finish;
          if (__position_00._M_current ==
              (this->_m_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<libDAI::Var,std::allocator<libDAI::Var>>::
            _M_realloc_insert<libDAI::Var_const&>
                      ((vector<libDAI::Var,std::allocator<libDAI::Var>> *)&this->_m_vars,
                       __position_00,&local_40);
          }
          else {
            (__position_00._M_current)->_label = local_40._label;
            (__position_00._M_current)->_states = local_40._states;
            ppVVar1 = &(this->_m_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppVVar1 = *ppVVar1 + 1;
          }
          local_64 = local_64 + 1;
          uVar8 = (ulong)((int)uVar8 + 1);
          peVar5 = (this->_m_bg).px;
          puVar4 = (peVar5->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
                   _m_nrTypes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(peVar5->super_BayesianGameIdenticalPayoffInterface).
                            super_BayesianGameBase._m_nrTypes.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 3) <= uVar6)
          goto LAB_0036c156;
        }
        uVar7 = uVar7 + 1;
      }
LAB_0036c156:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar6);
    }
    peVar5 = (this->_m_bg).px;
    puVar4 = (peVar5->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase._m_nrTypes.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(peVar5->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
                      _m_nrTypes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 3) <= uVar6) {
LAB_0036c167:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar6);
    }
    local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[uVar6] = puVar4[uVar6];
    if (1 < this->_m_verbosity) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Agent ",6);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," has ",5);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," types.",7);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
    }
    peVar5 = (this->_m_bg).px;
    puVar4 = (peVar5->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase._m_nrTypes.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(peVar5->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
                      _m_nrTypes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 3) <= uVar6)
    goto LAB_0036c167;
    __n = __n + local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar6];
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
              ((local_60->
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + uVar6,puVar4[uVar6]);
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

void BG_FactorGraphCreator::Construct_AgentTypePair_Variables()
{    
    _m_var_indices.resize( _m_bg->GetNrAgents() );
    size_t nrATs=0;
    vector<size_t> nrTypes(_m_bg->GetNrAgents() );
    for(Index agI = 0; agI < _m_bg->GetNrAgents(); agI++)
    {
        nrTypes[agI] =  _m_bg->GetNrTypes(agI);
        if(_m_verbosity >= 2)
            cout << "Agent "<<agI<<" has " << nrTypes[agI] << " types."<<endl;
        nrATs += nrTypes[agI];
        _m_var_indices[agI].reserve( _m_bg->GetNrTypes(agI) );
    }
    if(_m_verbosity >= 1)
        cout << "FactorGraph has "<<nrATs<<" variables (agent-types)"<<endl;
   
    //reserve memory 
    for(Index agI = 0; agI < _m_bg->GetNrAgents(); agI++)
        _m_var_indices[agI].reserve( nrTypes[agI] );
    _m_vars.reserve(nrATs);

    Index atI = 0;
    for(Index agI = 0; agI < _m_bg->GetNrAgents(); agI++)
        for(Index tI = 0; tI < _m_bg->GetNrTypes(agI); tI++)
        {
            //Note variables for higher agents have higher indices!
            libDAI::Var v(atI, _m_bg->GetNrActions(agI));
            _m_var_indices[agI].push_back(atI);
            _m_vars.push_back(v);
            atI++;
        }

}